

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O1

CURLcode tftp_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  char cVar2;
  char *pcVar3;
  
  pCVar1 = conn->data;
  conn->socktype = 2;
  pcVar3 = strstr((pCVar1->state).path,";mode=");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strstr((conn->host).rawalloc,";mode=");
  }
  if (pcVar3 != (char *)0x0) {
    *pcVar3 = '\0';
    cVar2 = Curl_raw_toupper(pcVar3[6]);
    (pCVar1->set).prefer_ascii = cVar2 == 'N' || cVar2 == 'A';
  }
  return CURLE_OK;
}

Assistant:

static CURLcode tftp_setup_connection(struct connectdata * conn)
{
  struct Curl_easy *data = conn->data;
  char *type;
  char command;

  conn->socktype = SOCK_DGRAM;   /* UDP datagram based */

  /* TFTP URLs support an extension like ";mode=<typecode>" that
   * we'll try to get now! */
  type = strstr(data->state.path, ";mode=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";mode=");

  if(type) {
    *type = 0;                   /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);

    switch(command) {
    case 'A': /* ASCII mode */
    case 'N': /* NETASCII mode */
      data->set.prefer_ascii = TRUE;
      break;

    case 'O': /* octet mode */
    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->set.prefer_ascii = FALSE;
      break;
    }
  }

  return CURLE_OK;
}